

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

SnapShot * TTD::SnapShot::Parse(int64 snapId,ThreadContext *threadContext)

{
  long lVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  SnapShot *pSVar6;
  SnapShot *snap;
  TextFormatReader snapreader;
  JsTTDStreamHandle snapHandle;
  TTDataIOInfo *iofp;
  char asciiResourceName [64];
  ThreadContext *threadContext_local;
  int64 snapId_local;
  
  asciiResourceName._56_8_ = threadContext;
  sprintf_s((char *)&iofp,0x40,"snap_%I64i.snp",snapId);
  lVar1 = *(long *)(asciiResourceName._56_8_ + 0x16a8);
  pcVar2 = *(code **)(lVar1 + 0x110);
  uVar3 = *(undefined8 *)(lVar1 + 0x130);
  uVar4 = *(undefined8 *)(lVar1 + 0x138);
  sVar5 = strlen((char *)&iofp);
  snapreader.m_keyNameLengthArray = (size_t *)(*pcVar2)(uVar3,uVar4,sVar5,&iofp,1,0);
  if (snapreader.m_keyNameLengthArray == (size_t *)0x0) {
    TTDAbort_unrecoverable_error("Failed to open snapshot resource stream for reading.");
  }
  TextFormatReader::TextFormatReader
            ((TextFormatReader *)&snap,snapreader.m_keyNameLengthArray,
             *(TTDReadBytesFromStreamCallback *)(lVar1 + 0x118),
             *(TTDFlushAndCloseStreamCallback *)(lVar1 + 0x128));
  pSVar6 = ParseSnapshotFromFile((FileReader *)&snap);
  TextFormatReader::~TextFormatReader((TextFormatReader *)&snap);
  return pSVar6;
}

Assistant:

SnapShot* SnapShot::Parse(int64 snapId, ThreadContext* threadContext)
    {
        char asciiResourceName[64];
        sprintf_s(asciiResourceName, 64, "snap_%I64i.snp", snapId);

        TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
        JsTTDStreamHandle snapHandle = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, true, false);
        TTDAssert(snapHandle != nullptr, "Failed to open snapshot resource stream for reading.");

        TTD_SNAP_READER snapreader(snapHandle, iofp.pfReadBytesFromStream, iofp.pfFlushAndCloseStream);
        SnapShot* snap = SnapShot::ParseSnapshotFromFile(&snapreader);

        return snap;
    }